

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_job.cpp
# Opt level: O0

void __thiscall r_exec::SaliencyPropagationJob::report(SaliencyPropagationJob *this,int64_t lag)

{
  DebugStream *pDVar1;
  allocator local_41;
  string local_40 [39];
  string local_19;
  int64_t local_18;
  int64_t lag_local;
  SaliencyPropagationJob *this_local;
  
  local_18 = lag;
  lag_local = (int64_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"saliency propagation job",&local_41);
  ::debug(&local_19);
  pDVar1 = DebugStream::operator<<((DebugStream *)&local_19,"late:");
  pDVar1 = DebugStream::operator<<(pDVar1,local_18);
  DebugStream::operator<<(pDVar1,"us behind.");
  DebugStream::~DebugStream((DebugStream *)&local_19);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void SaliencyPropagationJob::report(int64_t lag) const
{
    debug("saliency propagation job") << "late:" << lag << "us behind.";
}